

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall sfc::Subpalette::set(Subpalette *this,uint index,rgba_t color)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  iterator __first;
  iterator __last;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_48;
  value_type local_18;
  uint local_14;
  rgba_t color_local;
  uint index_local;
  Subpalette *this_local;
  
  local_18 = color;
  local_14 = index;
  _color_local = this;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_colors);
  vVar1 = local_18;
  if (local_14 < sVar2) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->_colors,(ulong)local_14);
    *pvVar3 = vVar1;
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_colors);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->_colors);
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_48,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              (&this->_colors_set,&local_48);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_48);
  }
  return;
}

Assistant:

void Subpalette::set(unsigned index, const rgba_t color) {
  if (_colors.size() > index) {
    _colors[index] = color;
    _colors_set = rgba_set_t(_colors.begin(), _colors.end());
  }
}